

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void nni_stat_unregister(nni_stat_item *item)

{
  nni_mtx_lock(&stats_lock);
  stat_unregister(item);
  nni_mtx_unlock(&stats_lock);
  return;
}

Assistant:

void
nni_stat_unregister(nni_stat_item *item)
{
#ifdef NNG_ENABLE_STATS
	nni_mtx_lock(&stats_lock);
	stat_unregister(item);
	nni_mtx_unlock(&stats_lock);
#else
	NNI_ARG_UNUSED(item);
#endif
}